

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O2

void __thiscall
duckdb::Executor::Initialize
          (Executor *this,
          unique_ptr<duckdb::PhysicalOperator,_std::default_delete<duckdb::PhysicalOperator>,_true>
          *physical_plan_p)

{
  type plan;
  
  Reset(this);
  ::std::__uniq_ptr_impl<duckdb::PhysicalOperator,_std::default_delete<duckdb::PhysicalOperator>_>::
  operator=((__uniq_ptr_impl<duckdb::PhysicalOperator,_std::default_delete<duckdb::PhysicalOperator>_>
             *)&this->owned_plan,
            (__uniq_ptr_impl<duckdb::PhysicalOperator,_std::default_delete<duckdb::PhysicalOperator>_>
             *)physical_plan_p);
  plan = unique_ptr<duckdb::PhysicalOperator,_std::default_delete<duckdb::PhysicalOperator>,_true>::
         operator*(&this->owned_plan);
  InitializeInternal(this,plan);
  return;
}

Assistant:

void Executor::Initialize(unique_ptr<PhysicalOperator> physical_plan_p) {
	Reset();
	owned_plan = std::move(physical_plan_p);
	InitializeInternal(*owned_plan);
}